

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::getExtractionUnits_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  string *psVar3;
  
  ppVar2 = getHandleInfo(this,handle);
  psVar3 = (string *)&gEmptyString_abi_cxx11_;
  if ((ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0) &&
     ((cVar1 = *(char *)((long)&(ppVar2->first)._M_string_length + 4), cVar1 == 'p' ||
      (cVar1 == 'i')))) {
    psVar3 = (string *)&ppVar2[1].first.field_2;
  }
  return psVar3;
}

Assistant:

const std::string& CommonCore::getExtractionUnits(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT:
            case InterfaceType::PUBLICATION:
                return handleInfo->units;
            default:
                break;
        }
    }
    return gEmptyString;
}